

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

char * ossprvcmd(char *hst)

{
  char *in_RDI;
  bool local_11;
  char *local_10;
  char *local_8;
  
  if (in_RDI == histtail) {
    local_8 = (char *)0x0;
  }
  else {
    local_10 = ossdechp(in_RDI);
    do {
      local_10 = ossdechp(local_10);
      local_11 = *local_10 != '\0' && local_10 != histtail;
    } while (local_11);
    if (*local_10 == '\0') {
      local_10 = ossadvhp(local_10);
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

char *ossprvcmd(char *hst)
{
    /* check to see if we're already at the fist command */
    if (hst == histtail)
        return 0;

    /* back up to the previous null byte */
    hst = ossdechp(hst);

    /* scan back to the previous line */
    do
    {
        hst = ossdechp(hst);
    } while (*hst && hst != histtail);

    /* step over the null byte to the start of the following line */
    if (*hst == 0)
        hst = ossadvhp(hst);

    /* return the result */
    return hst;
}